

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

void __thiscall Js::ScriptContext::InitializeAllocations(ScriptContext *this)

{
  ArenaAllocator *this_00;
  CharClassifier *this_01;
  InlineCache *pIVar1;
  uint *puVar2;
  BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar3;
  StringProfiler *this_02;
  BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *pBVar4;
  HeapAllocator *alloc;
  DebugContext *this_03;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  this_00 = &this->generalAllocator;
  this_01 = (CharClassifier *)new<Memory::ArenaAllocator>(0x48,this_00,0x35916e);
  CharClassifier::CharClassifier(this_01);
  this->charClassifier = this_01;
  pIVar1 = (InlineCache *)
           new<Memory::InlineCacheAllocator>(0x20,&this->inlineCacheAllocator,0x6dbe44);
  this->valueOfInlineCache = pIVar1;
  pIVar1 = (InlineCache *)
           new<Memory::InlineCacheAllocator>(0x20,&this->inlineCacheAllocator,0x6dbe44);
  this->toStringInlineCache = pIVar1;
  puVar2 = Memory::AllocateArray<Memory::ArenaAllocator,unsigned_int,false>
                     ((Memory *)this_00,(ArenaAllocator *)Memory::ArenaAllocator::AllocZero,0,0x2d);
  this->rejitReasonCounts = puVar2;
  puVar2 = Memory::AllocateArray<Memory::ArenaAllocator,unsigned_int,false>
                     ((Memory *)this_00,(ArenaAllocator *)Memory::ArenaAllocator::AllocZero,0,0x2d);
  this->rejitReasonCountsCap = puVar2;
  pBVar3 = (BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            *)new<Memory::ArenaAllocator>(0x38,this_00,0x35916e);
  JsUtil::
  BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(pBVar3,this_00,0);
  this->bailoutReasonCounts = pBVar3;
  pBVar3 = (BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            *)new<Memory::ArenaAllocator>(0x38,this_00,0x35916e);
  JsUtil::
  BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(pBVar3,this_00,0);
  this->bailoutReasonCountsCap = pBVar3;
  if (DAT_0144d960 == '\x01') {
    this_02 = (StringProfiler *)new<Memory::ArenaAllocator>(0x110,&this->miscAllocator,0x35916e);
    StringProfiler::StringProfiler
              (this_02,&(this->threadContext->pageAllocator).super_PageAllocator);
    this->stringProfiler = this_02;
  }
  pBVar4 = (BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            *)new<Memory::ArenaAllocator>(0x38,this_00,0x35916e);
  JsUtil::
  BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(pBVar4,this_00,0);
  this->intConstPropsOnGlobalObject = (PropIdSetForConstProp *)pBVar4;
  pBVar4 = (BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            *)new<Memory::ArenaAllocator>(0x38,this_00,0x35916e);
  JsUtil::
  BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(pBVar4,this_00,0);
  this->intConstPropsOnGlobalUserObject = (PropIdSetForConstProp *)pBVar4;
  local_58 = (undefined1  [8])&DebugContext::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2cb70d5;
  data.filename._0_4_ = 0x171;
  alloc = Memory::HeapAllocator::TrackAllocInfo
                    (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_58);
  this_03 = (DebugContext *)new<Memory::HeapAllocator>(0x20,alloc,0x2f6726);
  DebugContext::DebugContext(this_03,this);
  this->debugContext = this_03;
  return;
}

Assistant:

void ScriptContext::InitializeAllocations()
    {
        this->charClassifier = Anew(GeneralAllocator(), CharClassifier);

        this->valueOfInlineCache = AllocatorNewZ(InlineCacheAllocator, GetInlineCacheAllocator(), InlineCache);
        this->toStringInlineCache = AllocatorNewZ(InlineCacheAllocator, GetInlineCacheAllocator(), InlineCache);

#ifdef REJIT_STATS
        rejitReasonCounts = AnewArrayZ(GeneralAllocator(), uint, NumRejitReasons);
        rejitReasonCountsCap = AnewArrayZ(GeneralAllocator(), uint, NumRejitReasons);
        bailoutReasonCounts = Anew(GeneralAllocator(), BailoutStatsMap, GeneralAllocator());
        bailoutReasonCountsCap = Anew(GeneralAllocator(), BailoutStatsMap, GeneralAllocator());
#endif

#ifdef ENABLE_BASIC_TELEMETRY
        // TODO - allocate this on the Heap instead of using a custom allocator?
        this->telemetry = Anew(this->TelemetryAllocator(), Js::ScriptContextTelemetry, this);
#endif

#ifdef PROFILE_STRINGS
        if (Js::Configuration::Global.flags.ProfileStrings)
        {
            stringProfiler = Anew(MiscAllocator(), StringProfiler, threadContext->GetPageAllocator());
        }
#endif
        intConstPropsOnGlobalObject = Anew(GeneralAllocator(), PropIdSetForConstProp, GeneralAllocator());
        intConstPropsOnGlobalUserObject = Anew(GeneralAllocator(), PropIdSetForConstProp, GeneralAllocator());

#ifdef ENABLE_SCRIPT_DEBUGGING
        this->debugContext = HeapNew(DebugContext, this);
#endif
    }